

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::addIndex(PrimitiveRestartCase *this,deUint32 index)

{
  IndexType IVar1;
  undefined8 in_RAX;
  undefined8 uStack_8;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_INT) {
    uStack_8._0_4_ = (undefined4)in_RAX;
    uStack_8 = CONCAT44(index,(undefined4)uStack_8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->m_indicesUI,(uint *)((long)&uStack_8 + 4));
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    uStack_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    uStack_8._0_2_ = (undefined2)in_RAX;
    uStack_8._0_4_ = CONCAT22((short)index,(undefined2)uStack_8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&this->m_indicesUS,(unsigned_short *)((long)&uStack_8 + 2));
  }
  else if (IVar1 == INDEX_UNSIGNED_BYTE) {
    uStack_8._2_6_ = (undefined6)((ulong)in_RAX >> 0x10);
    uStack_8._0_2_ = CONCAT11((char)index,(char)in_RAX);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_indicesUB,(uchar *)((long)&uStack_8 + 1));
  }
  return;
}

Assistant:

void PrimitiveRestartCase::addIndex (deUint32 index)
{
	if (m_indexType == INDEX_UNSIGNED_BYTE)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_BYTE));
		m_indicesUB.push_back((deUint8)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_SHORT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_SHORT));
		m_indicesUS.push_back((deUint16)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_INT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_INT));
		m_indicesUI.push_back((deUint32)index);
	}
	else
		DE_ASSERT(DE_FALSE);
}